

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::addInstructionNoDebugInfo
          (Builder *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  Block *this_00;
  _Head_base<0UL,_spv::Instruction_*,_false> local_10;
  
  this_00 = this->buildPoint;
  local_10._M_head_impl =
       (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
       _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  Block::addInstruction
            (this_00,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_10);
  if (local_10._M_head_impl != (Instruction *)0x0) {
    (*(local_10._M_head_impl)->_vptr_Instruction[1])();
  }
  return;
}

Assistant:

void Builder::addInstructionNoDebugInfo(std::unique_ptr<Instruction> inst) {
    buildPoint->addInstruction(std::move(inst));
}